

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_leaflist(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  lyd_node *plVar1;
  LY_ERR LVar2;
  lysp_node *llist;
  lysp_node *plVar3;
  char *pcVar4;
  lysp_ext_instance **pplVar5;
  char *format;
  lysp_restr **extraout_RDX;
  lysp_restr **extraout_RDX_00;
  lysp_restr **restrs;
  lysp_node *plVar6;
  lysp_restr **extraout_RDX_01;
  lysp_restr **extraout_RDX_02;
  ly_ctx *plVar7;
  ly_stmt lVar8;
  lysp_ext_instance *parent_00;
  lysp_ext_instance **exts_00;
  char *pcVar9;
  bool bVar10;
  lysp_ext_instance **in_stack_ffffffffffffff50;
  ly_stmt kw;
  char *word;
  size_t word_len;
  uint16_t *local_90;
  lysp_type *local_88;
  lysp_node *local_80;
  lysp_ext_instance **local_78;
  lysp_node *local_70;
  uint32_t *local_68;
  uint16_t *local_60;
  lysp_node *local_58;
  lysp_ext_instance **local_50;
  lysp_ext_instance **local_48;
  uint16_t *local_40;
  char *buf;
  
  llist = (lysp_node *)calloc(1,0xd0);
  if (llist == (lysp_node *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar2 = LY_EMEM;
    ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_leaflist");
  }
  else {
    plVar6 = *siblings;
    if (*siblings != (lysp_node *)0x0) {
      do {
        plVar3 = plVar6;
        plVar6 = plVar3->next;
      } while (plVar6 != (lysp_node *)0x0);
      siblings = &plVar3->next;
    }
    *siblings = llist;
    llist->nodetype = 8;
    llist->parent = parent;
    exts_00 = (lysp_ext_instance **)&buf;
    LVar2 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&word,(char **)exts_00,&word_len);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    if (buf == (char *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar4 = word;
      if (word_len == 0) {
        pcVar4 = "";
      }
      LVar2 = lydict_insert(plVar7,pcVar4,word_len,&llist->name);
    }
    else {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar2 = lydict_insert_zc(plVar7,word,&llist->name);
    }
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    LVar2 = get_keyword(ctx,&kw,&word,&word_len);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    if (kw == LY_STMT_SYNTAX_SEMICOLON) {
      bVar10 = false;
      restrs = extraout_RDX;
    }
    else {
      if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar4 = lyplg_ext_stmt2str(kw);
        ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
        return LY_EVALID;
      }
      LVar2 = get_keyword(ctx,&kw,&word,&word_len);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      bVar10 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
      restrs = extraout_RDX_00;
    }
    exts = &llist->exts;
    local_40 = &llist[1].nodetype;
    local_48 = &llist[2].exts;
    local_88 = (lysp_type *)&llist[1].next;
    local_90 = &llist->flags;
    local_50 = (lysp_ext_instance **)&llist->ref;
    local_58 = llist + 1;
    local_60 = &llist[3].nodetype;
    local_68 = (uint32_t *)&llist[3].field_0xc;
    local_70 = (lysp_node *)&llist->iffeatures;
    local_78 = (lysp_ext_instance **)&llist->dsc;
    local_80 = llist + 3;
    lVar8 = kw;
    while (bVar10) {
      if (lVar8 == LY_STMT_WHEN) {
        LVar2 = parse_when(ctx,(lysp_when **)local_40);
      }
      else if (lVar8 == LY_STMT_DEFAULT) {
        plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        if (*(byte *)&plVar1[2].schema < 2) {
          plVar7 = (ly_ctx *)**(undefined8 **)plVar1;
          format = 
          "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
          ;
          pcVar4 = "yang:orig-default";
          goto LAB_0016fc9b;
        }
        lVar8 = LY_STMT_DEFAULT;
        plVar6 = local_80;
LAB_0016fba1:
        LVar2 = parse_qnames(ctx,lVar8,(lysp_qname **)plVar6,(yang_arg)exts,exts_00);
      }
      else {
        if (lVar8 == LY_STMT_DESCRIPTION) {
          parent_00 = *local_78;
          lVar8 = LY_STMT_DESCRIPTION;
          pplVar5 = local_78;
          goto LAB_0016fb27;
        }
        if (lVar8 == LY_STMT_EXTENSION_INSTANCE) {
          exts_00 = (lysp_ext_instance **)0x2000;
          LVar2 = parse_ext(ctx,word,word_len,llist,LY_STMT_LEAF_LIST,0,exts);
        }
        else {
          if (lVar8 == LY_STMT_IF_FEATURE) {
            lVar8 = LY_STMT_IF_FEATURE;
            plVar6 = local_70;
            goto LAB_0016fba1;
          }
          if (lVar8 == LY_STMT_MAX_ELEMENTS) {
            LVar2 = parse_maxelements(ctx,local_68,local_90,exts);
          }
          else if (lVar8 == LY_STMT_MIN_ELEMENTS) {
            LVar2 = parse_minelements(ctx,(uint32_t *)local_60,local_90,exts);
          }
          else if (lVar8 == LY_STMT_MUST) {
            LVar2 = parse_restrs(ctx,(ly_stmt)local_58,restrs);
          }
          else if (lVar8 == LY_STMT_ORDERED_BY) {
            LVar2 = parse_orderedby(ctx,llist);
          }
          else if (lVar8 == LY_STMT_REFERENCE) {
            parent_00 = *local_50;
            lVar8 = LY_STMT_REFERENCE;
            pplVar5 = local_50;
LAB_0016fb27:
            exts_00 = (lysp_ext_instance **)0x2;
            LVar2 = parse_text_field(ctx,parent_00,lVar8,(uint32_t)pplVar5,(char **)0x2,
                                     Y_IDENTIF_ARG,(uint16_t *)exts,in_stack_ffffffffffffff50);
          }
          else if (lVar8 == LY_STMT_STATUS) {
            LVar2 = parse_status(ctx,local_90,exts);
          }
          else if (lVar8 == LY_STMT_TYPE) {
            LVar2 = parse_type(ctx,local_88);
          }
          else {
            if (lVar8 == LY_STMT_UNITS) {
              parent_00 = *local_48;
              lVar8 = LY_STMT_UNITS;
              pplVar5 = local_48;
              goto LAB_0016fb27;
            }
            if (lVar8 != LY_STMT_CONFIG) {
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar7 = (ly_ctx *)0x0;
              }
              else {
                plVar7 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar4 = lyplg_ext_stmt2str(lVar8);
              format = "Invalid keyword \"%s\" as a child of \"%s\".";
              pcVar9 = "llist";
              goto LAB_0016fca7;
            }
            LVar2 = parse_config(ctx,local_90,exts);
          }
        }
      }
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      LVar2 = get_keyword(ctx,&kw,&word,&word_len);
      lVar8 = kw;
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      bVar10 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
      restrs = extraout_RDX_01;
      if (((!bVar10) && (*exts != (lysp_ext_instance *)0x0)) &&
         (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
         restrs = extraout_RDX_02, LVar2 != LY_SUCCESS)) {
        return LVar2;
      }
    }
    LVar2 = LY_SUCCESS;
    if (local_88->name == (char *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
      pcVar4 = "decimal64 type";
LAB_0016fc9b:
      pcVar4 = pcVar4 + 10;
      pcVar9 = "leaf-list";
LAB_0016fca7:
      ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar4,pcVar9);
      return LY_EVALID;
    }
  }
  return LVar2;
}

Assistant:

LY_ERR
parse_leaflist(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node **siblings)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_leaflist *llist;

    /* create new leaf-list structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, llist, next, LY_EMEM);
    llist->nodetype = LYS_LEAFLIST;
    llist->parent = parent;

    /* get name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, llist->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &llist->flags, &llist->exts));
            break;
        case LY_STMT_DEFAULT:
            PARSER_CHECK_STMTVER2_RET(ctx, "default", "leaf-list");
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_DEFAULT, &llist->dflts, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, llist->dsc, LY_STMT_DESCRIPTION, 0, &llist->dsc, Y_STR_ARG, NULL, &llist->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &llist->iffeatures, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(parse_maxelements(ctx, &llist->max, &llist->flags, &llist->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(parse_minelements(ctx, &llist->min, &llist->flags, &llist->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(parse_restrs(ctx, kw, &llist->musts));
            break;
        case LY_STMT_ORDERED_BY:
            LY_CHECK_RET(parse_orderedby(ctx, &llist->node));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, llist->ref, LY_STMT_REFERENCE, 0, &llist->ref, Y_STR_ARG, NULL, &llist->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &llist->flags, &llist->exts));
            break;
        case LY_STMT_TYPE:
            LY_CHECK_RET(parse_type(ctx, &llist->type));
            break;
        case LY_STMT_UNITS:
            LY_CHECK_RET(parse_text_field(ctx, llist->units, LY_STMT_UNITS, 0, &llist->units, Y_STR_ARG, NULL, &llist->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(parse_when(ctx, &llist->when));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, llist, LY_STMT_LEAF_LIST, 0, &llist->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "llist");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, llist->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!llist->type.name) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "type", "leaf-list");
        return LY_EVALID;
    }

cleanup:
    return ret;
}